

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edit_distance.cpp
# Opt level: O2

bool __thiscall EditDistance::propagate(EditDistance *this)

{
  ExplLevel EVar1;
  int *piVar2;
  IntVar *pIVar3;
  int iVar4;
  Clause *pCVar5;
  int i;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  int upperBound;
  ulong uVar9;
  EdExplFinder edExplFinder;
  
  iVar4 = this->seqSize * this->max_id_cost * 2;
  upperBound = this->max_id_cost * this->cellChanges * 2 + (this->lastBound).v;
  if (iVar4 <= upperBound) {
    upperBound = iVar4;
  }
  updateDpMatrix(this,upperBound);
  this->cellChanges = 0;
  piVar2 = (this->cellHasChanged).data;
  for (lVar6 = 0; iVar4 = this->seqSize,
      SBORROW8(lVar6,(long)iVar4 * 2) != lVar6 + (long)iVar4 * -2 < 0; lVar6 = lVar6 + 1) {
    piVar2[lVar6] = 0;
  }
  iVar4 = (this->dpMatrix).data[(uint)((iVar4 + 2) * iVar4)];
  Tint::operator=(&this->lastBound,iVar4);
  bVar8 = true;
  if ((((this->ed).var)->min).v < iVar4) {
    EVar1 = this->explLevel;
    if (EVar1 == E_NAIVE) {
      uVar7 = (ulong)(uint)this->seqSize;
      if (this->seqSize < 1) {
        uVar7 = 0;
      }
      uVar9 = 0;
      do {
        if (uVar7 * 0x10 + 0x10 == uVar9 + 0x10) goto LAB_001585b0;
        lVar6 = *(long *)((long)&this->seq1->var + uVar9);
      } while ((*(int *)(lVar6 + 0xc) == *(int *)(lVar6 + 0x10)) &&
              (lVar6 = *(long *)((long)&this->seq2->var + uVar9), uVar9 = uVar9 + 0x10,
              *(int *)(lVar6 + 0xc) == *(int *)(lVar6 + 0x10)));
    }
    else {
LAB_001585b0:
      if (so.lazy == true) {
        if (EVar1 == E_FULL) {
          EdExplFinder::EdExplFinder(&edExplFinder);
          pCVar5 = EdExplFinder::FindEdExplanation
                             (&edExplFinder,*(int *)&(this->super_Propagator).field_0x14,
                              &this->insertion_cost,&this->deletion_cost,&this->substitution_cost,
                              this->seq1,this->seq2,&this->dpMatrix,iVar4,this->seqSize,
                              this->min_id_cost);
          EdExplFinder::~EdExplFinder(&edExplFinder);
        }
        else if (EVar1 == E_NAIVE) {
          pCVar5 = getNaiveExplanation(this);
        }
        else {
          pCVar5 = (Clause *)0x0;
        }
        pIVar3 = (this->ed).var;
        iVar4 = (*(pIVar3->super_Var).super_Branching._vptr_Branching[0xe])
                          (pIVar3,(long)iVar4,pCVar5,1);
        if ((char)iVar4 == '\0') {
          bVar8 = false;
        }
      }
    }
  }
  return bVar8;
}

Assistant:

bool propagate() override {
		// Step 1:
		// Update dp matrix according to change
		//

#ifndef NDEBUG
		std::cout << "lastBound = " << lastBound << '\n';
		std::cout << "cellChanges = " << cellChanges << '\n';
		std::cout << "cellHasChanged = [";
		for (int i = 0; i < seqSize * 2; i++) {
			std::cout << cellHasChanged[i] << " ";
		}
		std::cout << "]" << '\n';
#endif

		const int ub = std::min(2 * seqSize * max_id_cost, lastBound + cellChanges * 2 * max_id_cost);

		updateDpMatrix(ub);
		cellChanges = 0;
		for (int i = 0; i < seqSize * 2; i++) {
			cellHasChanged[i] = 0;
		}

#ifndef NDEBUG
		printCurrentDpMatrix();
#endif

		// Step 2:
		// Propagate lower bound to edit distance, and add explanation
		//

		// calc edit distance
		const int editDistanceLB = getEditDistanceLB();

		lastBound = editDistanceLB;

		if (ed.getMin() < editDistanceLB) {
#ifndef NDEBUG
			std::cout << "ED " << editDistanceLB << '\n';
#endif

			if (explLevel == E_NAIVE) {
				// in case of naive explanation, check if all variables are fixed
				for (int i = 0; i < seqSize; i++) {
					if (!seq1[i].isFixed() || !seq2[i].isFixed()) {
						return true;
					}
				}
			}
			if (ed.setMinNotR(editDistanceLB)) {
				Clause* r = nullptr;
				if (so.lazy) {
					switch (explLevel) {
						case E_NAIVE:
							r = getNaiveExplanation();
							break;
						case E_FULL:
							EdExplFinder edExplFinder;
							// launch inequality finder for explanation
							r = edExplFinder.FindEdExplanation(max_char, &insertion_cost, &deletion_cost,
																								 &substitution_cost, seq1, seq2, &dpMatrix,
																								 editDistanceLB, seqSize, min_id_cost);
							break;
					}

					if (!ed.setMin(editDistanceLB, r)) {
						return false;
					}
				}
			}
		}

		return true;
	}